

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void xdgDecorationHandleConfigure
               (void *userData,zxdg_toplevel_decoration_v1 *decoration,uint32_t mode)

{
  _GLFWwindow *window;
  uint32_t mode_local;
  zxdg_toplevel_decoration_v1 *decoration_local;
  void *userData_local;
  
  *(uint32_t *)((long)userData + 0x3d0) = mode;
  if (mode == 1) {
    if ((*(int *)((long)userData + 0xc) != 0) && (*(long *)((long)userData + 0x50) == 0)) {
      createFallbackDecorations((_GLFWwindow *)userData);
    }
  }
  else {
    destroyFallbackDecorations((_GLFWwindow *)userData);
  }
  return;
}

Assistant:

static void xdgDecorationHandleConfigure(void* userData,
                                         struct zxdg_toplevel_decoration_v1* decoration,
                                         uint32_t mode)
{
    _GLFWwindow* window = userData;

    window->wl.xdg.decorationMode = mode;

    if (mode == ZXDG_TOPLEVEL_DECORATION_V1_MODE_CLIENT_SIDE)
    {
        if (window->decorated && !window->monitor)
            createFallbackDecorations(window);
    }
    else
        destroyFallbackDecorations(window);
}